

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_trc.c
# Opt level: O0

void trc_infof(Curl_easy *data,curl_trc_feat *feat,char *opt_id,int opt_id_idx,char *fmt,
              __va_list_tag *ap)

{
  int iVar1;
  size_t size;
  char local_848 [8];
  char buf [2048];
  size_t local_40;
  size_t len;
  __va_list_tag *ap_local;
  char *fmt_local;
  int opt_id_idx_local;
  char *opt_id_local;
  curl_trc_feat *feat_local;
  Curl_easy *data_local;
  
  local_40 = 0;
  if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)) &&
      (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) &&
     (0 < Curl_trc_feat_ids.log_level)) {
    local_40 = trc_print_ids(data,local_848,0x800);
  }
  if (feat != (curl_trc_feat *)0x0) {
    iVar1 = curl_msnprintf(local_848 + local_40,0x800 - local_40,"[%s] ",feat->name);
    local_40 = (long)iVar1 + local_40;
  }
  if (opt_id != (char *)0x0) {
    if (opt_id_idx < 1) {
      iVar1 = curl_msnprintf(local_848 + local_40,0x800 - local_40,"[%s] ",opt_id);
    }
    else {
      iVar1 = curl_msnprintf(local_848 + local_40,0x800 - local_40,"[%s-%d] ",opt_id,
                             (ulong)(uint)opt_id_idx);
    }
    local_40 = (long)iVar1 + local_40;
  }
  iVar1 = curl_mvsnprintf(local_848 + local_40,0x800 - local_40,fmt,ap);
  size = trc_end_buf(local_848,(long)iVar1 + local_40,0x800,true);
  trc_write(data,CURLINFO_TEXT,local_848,size);
  return;
}

Assistant:

static void trc_infof(struct Curl_easy *data,
                      struct curl_trc_feat *feat,
                      const char *opt_id, int opt_id_idx,
                      const char * const fmt, va_list ap)
{
  size_t len = 0;
  char buf[TRC_LINE_MAX];

  if(CURL_TRC_IDS(data))
    len += trc_print_ids(data, buf + len, TRC_LINE_MAX - len);
  if(feat)
    len += msnprintf(buf + len, TRC_LINE_MAX - len, "[%s] ", feat->name);
  if(opt_id) {
    if(opt_id_idx > 0)
      len += msnprintf(buf + len, TRC_LINE_MAX - len, "[%s-%d] ",
                       opt_id, opt_id_idx);
    else
      len += msnprintf(buf + len, TRC_LINE_MAX - len, "[%s] ", opt_id);
  }
  len += mvsnprintf(buf + len, TRC_LINE_MAX - len, fmt, ap);
  len = trc_end_buf(buf, len, TRC_LINE_MAX, TRUE);
  trc_write(data, CURLINFO_TEXT, buf, len);
}